

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

Delay3Syntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::Delay3Syntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2,Token *args_3,
          ExpressionSyntax **args_4,Token *args_5,ExpressionSyntax **args_6,Token *args_7)

{
  ExpressionSyntax *pEVar1;
  ExpressionSyntax *pEVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  Info *pIVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  TokenKind TVar16;
  undefined1 uVar17;
  NumericTokenFlags NVar18;
  uint32_t uVar19;
  TokenKind TVar20;
  undefined1 uVar21;
  NumericTokenFlags NVar22;
  uint32_t uVar23;
  TokenKind TVar24;
  undefined1 uVar25;
  NumericTokenFlags NVar26;
  uint32_t uVar27;
  Delay3Syntax *pDVar28;
  
  pDVar28 = (Delay3Syntax *)allocate(this,0x80,8);
  TVar8 = args->kind;
  uVar9 = args->field_0x2;
  NVar10.raw = (args->numFlags).raw;
  uVar11 = args->rawLen;
  pIVar3 = args->info;
  TVar12 = args_1->kind;
  uVar13 = args_1->field_0x2;
  NVar14.raw = (args_1->numFlags).raw;
  uVar15 = args_1->rawLen;
  pIVar4 = args_1->info;
  TVar16 = args_3->kind;
  uVar17 = args_3->field_0x2;
  NVar18.raw = (args_3->numFlags).raw;
  uVar19 = args_3->rawLen;
  pIVar5 = args_3->info;
  pEVar1 = *args_4;
  TVar20 = args_5->kind;
  uVar21 = args_5->field_0x2;
  NVar22.raw = (args_5->numFlags).raw;
  uVar23 = args_5->rawLen;
  pIVar6 = args_5->info;
  pEVar2 = *args_6;
  TVar24 = args_7->kind;
  uVar25 = args_7->field_0x2;
  NVar26.raw = (args_7->numFlags).raw;
  uVar27 = args_7->rawLen;
  pIVar7 = args_7->info;
  (pDVar28->super_TimingControlSyntax).super_SyntaxNode.kind = Delay3;
  (pDVar28->super_TimingControlSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pDVar28->super_TimingControlSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pDVar28->hash).kind = TVar8;
  (pDVar28->hash).field_0x2 = uVar9;
  (pDVar28->hash).numFlags = (NumericTokenFlags)NVar10.raw;
  (pDVar28->hash).rawLen = uVar11;
  (pDVar28->hash).info = pIVar3;
  (pDVar28->openParen).kind = TVar12;
  (pDVar28->openParen).field_0x2 = uVar13;
  (pDVar28->openParen).numFlags = (NumericTokenFlags)NVar14.raw;
  (pDVar28->openParen).rawLen = uVar15;
  (pDVar28->openParen).info = pIVar4;
  (pDVar28->delay1).ptr = args_2;
  (pDVar28->comma1).kind = TVar16;
  (pDVar28->comma1).field_0x2 = uVar17;
  (pDVar28->comma1).numFlags = (NumericTokenFlags)NVar18.raw;
  (pDVar28->comma1).rawLen = uVar19;
  (pDVar28->comma1).info = pIVar5;
  pDVar28->delay2 = pEVar1;
  (pDVar28->comma2).kind = TVar20;
  (pDVar28->comma2).field_0x2 = uVar21;
  (pDVar28->comma2).numFlags = (NumericTokenFlags)NVar22.raw;
  (pDVar28->comma2).rawLen = uVar23;
  (pDVar28->comma2).info = pIVar6;
  pDVar28->delay3 = pEVar2;
  (pDVar28->closeParen).kind = TVar24;
  (pDVar28->closeParen).field_0x2 = uVar25;
  (pDVar28->closeParen).numFlags = (NumericTokenFlags)NVar26.raw;
  (pDVar28->closeParen).rawLen = uVar27;
  (pDVar28->closeParen).info = pIVar7;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pDVar28;
  if (pEVar1 != (ExpressionSyntax *)0x0) {
    (pEVar1->super_SyntaxNode).parent = (SyntaxNode *)pDVar28;
  }
  if (pEVar2 != (ExpressionSyntax *)0x0) {
    (pEVar2->super_SyntaxNode).parent = (SyntaxNode *)pDVar28;
  }
  return pDVar28;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }